

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9_hashmap_product(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  sxu32 sVar2;
  long lVar3;
  long lVar4;
  undefined8 *puVar5;
  char **ppcVar6;
  ulong uVar7;
  jx9_value *pjVar8;
  uint uVar9;
  sxi64 sVar10;
  uint uVar11;
  long *plVar12;
  sxi64 nv;
  double local_40;
  double local_38;
  
  if ((0 < nArg) && (((*apArg)->iFlags & 0x40) != 0)) {
    lVar3 = ((*apArg)->x).iVal;
    uVar9 = *(uint *)(lVar3 + 0x2c);
    if (uVar9 != 0) {
      uVar11 = *(uint *)(*(undefined8 **)(lVar3 + 0x10) + 7);
      lVar4 = *(long *)**(undefined8 **)(lVar3 + 0x10);
      if ((uVar11 < *(uint *)(lVar4 + 0x210)) && (*(long *)(lVar4 + 0x208) != 0)) {
        plVar12 = (long *)(lVar3 + 0x10);
        if ((*(byte *)(*(long *)(lVar4 + 0x208) + 8 + (ulong)(uVar11 * *(int *)(lVar4 + 0x218))) & 4
            ) != 0) {
          local_38 = 1.0;
          do {
            puVar5 = (undefined8 *)*plVar12;
            lVar3 = *(long *)*puVar5;
            if ((*(uint *)(puVar5 + 7) < *(uint *)(lVar3 + 0x210)) &&
               (ppcVar6 = *(char ***)(lVar3 + 0x208), ppcVar6 != (char **)0x0)) {
              uVar7 = (ulong)(*(uint *)(puVar5 + 7) * *(int *)(lVar3 + 0x218));
              uVar11 = *(uint *)((long)ppcVar6 + uVar7 + 8);
              if ((uVar11 & 0x160) == 0) {
                if ((uVar11 & 4) == 0) {
                  if ((uVar11 & 10) == 0) {
                    if (((uVar11 & 1) != 0) &&
                       (sVar2 = *(sxu32 *)((long)ppcVar6 + uVar7 + 0x28), sVar2 != 0)) {
                      local_40 = 0.0;
                      SyStrToReal(*(char **)((long)ppcVar6 + uVar7 + 0x20),sVar2,&local_40,ppcVar6);
                      local_38 = local_38 * local_40;
                    }
                  }
                  else {
                    local_38 = local_38 * (double)*(long *)((long)ppcVar6 + uVar7);
                  }
                }
                else {
                  local_38 = local_38 * *(double *)((long)ppcVar6 + uVar7);
                }
              }
            }
            plVar12 = puVar5 + 9;
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
          pjVar8 = pCtx->pRet;
          jx9MemObjRelease(pjVar8);
          (pjVar8->x).rVal = local_38;
          pjVar8->iFlags = pjVar8->iFlags & 0xfffffe90U | 4;
          jx9MemObjTryInteger(pjVar8);
          return 0;
        }
        sVar10 = 1;
        uVar11 = 0;
        do {
          puVar5 = (undefined8 *)*plVar12;
          lVar4 = *(long *)*puVar5;
          if ((*(uint *)(puVar5 + 7) < *(uint *)(lVar4 + 0x210)) &&
             (ppcVar6 = *(char ***)(lVar4 + 0x208), ppcVar6 != (char **)0x0)) {
            uVar7 = (ulong)(*(uint *)(puVar5 + 7) * *(int *)(lVar4 + 0x218));
            uVar1 = *(uint *)((long)ppcVar6 + uVar7 + 8);
            if ((uVar1 & 0x160) == 0) {
              if ((uVar1 & 4) == 0) {
                if ((uVar1 & 10) == 0) {
                  if (((uVar1 & 1) != 0) &&
                     (sVar2 = *(sxu32 *)((long)ppcVar6 + uVar7 + 0x28), sVar2 != 0)) {
                    local_40 = 0.0;
                    SyStrToInt64(*(char **)((long)ppcVar6 + uVar7 + 0x20),sVar2,&local_40,ppcVar6);
                    sVar10 = sVar10 * (long)local_40;
                    uVar9 = *(uint *)(lVar3 + 0x2c);
                  }
                }
                else {
                  sVar10 = sVar10 * *(long *)((long)ppcVar6 + uVar7);
                }
              }
              else {
                sVar10 = sVar10 * (long)*(double *)((long)ppcVar6 + uVar7);
              }
            }
          }
          plVar12 = puVar5 + 9;
          uVar11 = uVar11 + 1;
        } while (uVar11 < uVar9);
        pjVar8 = pCtx->pRet;
        jx9MemObjRelease(pjVar8);
        (pjVar8->x).iVal = sVar10;
        goto LAB_00137a11;
      }
    }
  }
  pjVar8 = pCtx->pRet;
  jx9MemObjRelease(pjVar8);
  (pjVar8->x).rVal = 0.0;
LAB_00137a11:
  pjVar8->iFlags = pjVar8->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9_hashmap_product(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap *pMap;
	jx9_value *pObj;
	if( nArg < 1 ){
		/* Missing arguments, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid hashmap */
	if( !jx9_value_is_json_array(apArg[0]) ){
		/* Invalid argument, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	if( pMap->nEntry < 1 ){
		/* Nothing to compute, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* If the first element is of type float, then perform floating
	 * point computaion.Otherwise switch to int64 computaion.
	 */
	pObj = HashmapExtractNodeValue(pMap->pFirst);
	if( pObj == 0 ){
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	if( pObj->iFlags & MEMOBJ_REAL ){
		DoubleProd(pCtx, pMap);
	}else{
		Int64Prod(pCtx, pMap);
	}
	return JX9_OK;
}